

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O2

void cubeb_async_log(char *fmt,...)

{
  char in_AL;
  cubeb_async_logger *this;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char msg [256];
  undefined8 local_1d8;
  void **local_1d0;
  undefined1 *local_1c8;
  undefined1 local_1b8 [8];
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  char local_108 [256];
  
  if (in_AL != '\0') {
    local_188 = in_XMM0_Qa;
    local_178 = in_XMM1_Qa;
    local_168 = in_XMM2_Qa;
    local_158 = in_XMM3_Qa;
    local_148 = in_XMM4_Qa;
    local_138 = in_XMM5_Qa;
    local_128 = in_XMM6_Qa;
    local_118 = in_XMM7_Qa;
  }
  if (g_cubeb_log_callback != (cubeb_log_callback)0x0) {
    local_1c8 = local_1b8;
    local_1d0 = &args[0].overflow_arg_area;
    local_1d8 = 0x3000000008;
    local_1b0 = in_RSI;
    local_1a8 = in_RDX;
    local_1a0 = in_RCX;
    local_198 = in_R8;
    local_190 = in_R9;
    vsnprintf(local_108,0x100,fmt,&local_1d8);
    this = cubeb_async_logger::get();
    cubeb_async_logger::push(this,local_108);
  }
  return;
}

Assistant:

void
cubeb_async_log(char const * fmt, ...)
{
  if (!g_cubeb_log_callback) {
    return;
  }
  // This is going to copy a 256 bytes array around, which is fine.
  // We don't want to allocate memory here, because this is made to
  // be called from a real-time callback.
  va_list args;
  va_start(args, fmt);
  char msg[CUBEB_LOG_MESSAGE_MAX_SIZE];
  vsnprintf(msg, CUBEB_LOG_MESSAGE_MAX_SIZE, fmt, args);
  cubeb_async_logger::get().push(msg);
  va_end(args);
}